

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void gray_rgb565D_convert
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
               JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  JSAMPLE *pJVar3;
  JSAMPROW pJVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  uint g_1;
  JLONG rgb_1;
  JLONG d0_1;
  JDIMENSION num_cols_1;
  JSAMPLE *range_limit_1;
  JDIMENSION col_1;
  JSAMPROW outptr_1;
  JSAMPROW inptr_1;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  ulong uStack_58;
  int test_value;
  uint g;
  JLONG rgb;
  JLONG d0;
  uint *puStack_38;
  JDIMENSION num_cols;
  JSAMPLE *range_limit;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  
  pJVar3 = cinfo->sample_range_limit;
  g = cinfo->output_width;
  uStack_58 = dither_matrix[cinfo->output_scanline & 3];
  col = num_rows;
  outptr = (JSAMPROW)output_buf;
  inptr._4_4_ = input_row;
  while (col = col - 1, -1 < (int)col) {
    uVar7 = inptr._4_4_ + 1;
    pbVar5 = (*input_buf)[inptr._4_4_];
    pJVar4 = outptr + 8;
    puStack_38 = *(uint **)outptr;
    range_limit = pbVar5;
    if (((ulong)puStack_38 & 3) != 0) {
      range_limit = pbVar5 + 1;
      bVar1 = pJVar3[(ulong)*pbVar5 + (uStack_58 & 0xff)];
      *(ushort *)puStack_38 =
           (ushort)((bVar1 & 0xf8) << 8) | (ushort)((bVar1 & 0xfc) << 3) | (ushort)(bVar1 >> 3);
      puStack_38 = (uint *)((long)puStack_38 + 2);
      g = g - 1;
    }
    for (d0._4_4_ = 0; d0._4_4_ < g >> 1; d0._4_4_ = d0._4_4_ + 1) {
      pbVar5 = range_limit + 1;
      bVar1 = pJVar3[(ulong)*range_limit + (uStack_58 & 0xff)];
      uVar6 = (long)uStack_58 >> 8;
      range_limit = range_limit + 2;
      bVar2 = pJVar3[(ulong)*pbVar5 + (uVar6 & 0xff)];
      uStack_58 = (uVar6 & 0xff) << 0x18 |
                  (long)((uStack_58 & 0xff) << 0x18 | uVar6 & 0xffffff) >> 8;
      *puStack_38 = ((bVar2 & 0xf8) << 8 | (bVar2 & 0xfc) << 3 | (uint)(bVar2 >> 3)) << 0x10 |
                    (bVar1 & 0xf8) << 8 | (bVar1 & 0xfc) << 3 | (uint)(bVar1 >> 3);
      puStack_38 = puStack_38 + 1;
    }
    outptr = pJVar4;
    inptr._4_4_ = uVar7;
    if ((g & 1) != 0) {
      bVar1 = pJVar3[(ulong)*range_limit + (uStack_58 & 0xff)];
      *(ushort *)puStack_38 =
           (ushort)((bVar1 & 0xf8) << 8) | (ushort)((bVar1 & 0xfc) << 3) | (ushort)(bVar1 >> 3);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb565D_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    gray_rgb565D_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    gray_rgb565D_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}